

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O3

ssize_t __thiscall
capnp::anon_unknown_34::BrokenRequest::send
          (BrokenRequest *this,int __fd,void *__buf,size_t __n,int __flags)

{
  char *pcVar1;
  undefined4 in_register_00000034;
  Refcounted *refcounted;
  Exception *other;
  PromiseNode *ptrCopy;
  _func_int **local_1c0;
  Exception local_1b8;
  
  other = (Exception *)(CONCAT44(in_register_00000034,__fd) + 0x10);
  kj::Exception::Exception(&local_1b8,other);
  kj::_::PromiseDisposer::
  alloc<kj::_::ImmediateBrokenPromiseNode,kj::_::PromiseDisposer,kj::Exception>
            ((PromiseDisposer *)&local_1c0,&local_1b8);
  pcVar1 = (char *)operator_new(0x1a8);
  pcVar1[0x10] = '\0';
  pcVar1[0x11] = '\0';
  pcVar1[0x12] = '\0';
  pcVar1[0x13] = '\0';
  *(undefined ***)pcVar1 = &PTR_addRef_0037b278;
  *(undefined **)(pcVar1 + 8) = &DAT_0037b2b0;
  kj::Exception::Exception((Exception *)(pcVar1 + 0x18),other);
  *(int *)(pcVar1 + 0x10) = *(int *)(pcVar1 + 0x10) + 1;
  (this->super_RequestHook)._vptr_RequestHook = local_1c0;
  (this->super_RequestHook).brand = pcVar1 + 8;
  (this->exception).ownFile.content.ptr = pcVar1;
  (this->exception).ownFile.content.size_ = 0;
  (this->exception).ownFile.content.disposer = (ArrayDisposer *)0x0;
  (this->exception).file = (char *)0x0;
  kj::Exception::~Exception(&local_1b8);
  return (ssize_t)this;
}

Assistant:

RemotePromise<AnyPointer> send() override {
    return RemotePromise<AnyPointer>(kj::cp(exception),
        AnyPointer::Pipeline(kj::refcounted<BrokenPipeline>(exception)));
  }